

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

void xfer_upload_data(fxp_xfer *xfer,char *buffer,int len)

{
  int iVar1;
  uint64_t offset;
  req *prVar2;
  req *prVar3;
  sftp_request *psVar4;
  req **pprVar5;
  
  prVar3 = (req *)safemalloc(1,0x30,0);
  offset = xfer->offset;
  prVar3->offset = offset;
  prVar3->complete = 0;
  prVar2 = xfer->tail;
  pprVar5 = &prVar2->next;
  if (prVar2 == (req *)0x0) {
    pprVar5 = &xfer->head;
  }
  *pprVar5 = prVar3;
  prVar3->prev = prVar2;
  xfer->tail = prVar3;
  prVar3->next = (req *)0x0;
  prVar3->len = len;
  prVar3->buffer = (char *)0x0;
  psVar4 = fxp_write_send(xfer->fh,buffer,offset,len);
  psVar4->registered = true;
  psVar4->userdata = prVar3;
  iVar1 = prVar3->len;
  xfer->offset = xfer->offset + (long)iVar1;
  xfer->req_totalsize = xfer->req_totalsize + iVar1;
  return;
}

Assistant:

void xfer_upload_data(struct fxp_xfer *xfer, char *buffer, int len)
{
    struct req *rr;
    struct sftp_request *req;

    rr = snew(struct req);
    rr->offset = xfer->offset;
    rr->complete = 0;
    if (xfer->tail) {
        xfer->tail->next = rr;
        rr->prev = xfer->tail;
    } else {
        xfer->head = rr;
        rr->prev = NULL;
    }
    xfer->tail = rr;
    rr->next = NULL;

    rr->len = len;
    rr->buffer = NULL;
    sftp_register(req = fxp_write_send(xfer->fh, buffer, rr->offset, len));
    fxp_set_userdata(req, rr);

    xfer->offset += rr->len;
    xfer->req_totalsize += rr->len;

#ifdef DEBUG_UPLOAD
    printf("queueing write request %p at %"PRIu64" [len %d]\n",
           rr, rr->offset, len);
#endif
}